

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprVariableDefinitions *
AnalyzeVariableDefinitions(ExpressionContext *ctx,SynVariableDefinitions *syntax)

{
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  TypeBase *pTVar1;
  uint alignment;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  TypeBase *pTVar4;
  ExprBase *node;
  ExprVariableDefinitions *pEVar5;
  SynVariableDefinition *syntax_00;
  IntrusiveList<ExprBase> definitions;
  SynIdentifier *name;
  undefined4 extraout_var_01;
  
  if (syntax->align == (SynAlign *)0x0) {
    alignment = 0;
  }
  else {
    alignment = AnalyzeAlignment(ctx,syntax->align);
  }
  pTVar4 = ctx->scope->ownerType;
  if (pTVar4 == (TypeBase *)0x0) {
    pTVar4 = AnalyzeType(ctx,syntax->type,true,(bool *)0x0);
  }
  else {
    ExpressionContext::PushTemporaryScope(ctx);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    allocator = ctx->allocator;
    scope = ctx->scope;
    type = ExpressionContext::GetReferenceType(ctx,pTVar4);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    name = (SynIdentifier *)CONCAT44(extraout_var_00,iVar3);
    (name->super_SynBase).typeID = 4;
    (name->super_SynBase).begin = (Lexeme *)0x0;
    (name->super_SynBase).end = (Lexeme *)0x0;
    (name->super_SynBase).pos.begin = (char *)0x0;
    (name->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
    (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
    (name->name).begin = "this";
    (name->name).end = "";
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              ((VariableData *)CONCAT44(extraout_var,iVar2),allocator,&syntax->super_SynBase,scope,0
               ,&type->super_TypeBase,name,0,uniqueId);
    ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var,iVar2),true);
    pTVar4 = AnalyzeType(ctx,syntax->type,true,(bool *)0x0);
    ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY,true);
  }
  definitions.head = (ExprBase *)0x0;
  definitions.tail = (ExprBase *)0x0;
  syntax_00 = (syntax->definitions).head;
  if (syntax_00 != (SynVariableDefinition *)0x0) {
    do {
      node = AnalyzeVariableDefinition(ctx,syntax_00,alignment,pTVar4);
      IntrusiveList<ExprBase>::push_back(&definitions,node);
      syntax_00 = (SynVariableDefinition *)(syntax_00->super_SynBase).next;
      if (syntax_00 == (SynVariableDefinition *)0x0) break;
    } while ((syntax_00->super_SynBase).typeID == 0x33);
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar5 = (ExprVariableDefinitions *)CONCAT44(extraout_var_01,iVar2);
  pTVar1 = ctx->typeVoid;
  (pEVar5->super_ExprBase).typeID = 0x21;
  (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar5->super_ExprBase).type = pTVar1;
  (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar5->super_ExprBase).listed = false;
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6c18;
  pEVar5->definitionType = pTVar4;
  (pEVar5->definitions).head = definitions.head;
  (pEVar5->definitions).tail = definitions.tail;
  return pEVar5;
}

Assistant:

ExprVariableDefinitions* AnalyzeVariableDefinitions(ExpressionContext &ctx, SynVariableDefinitions *syntax)
{
	unsigned alignment = syntax->align ? AnalyzeAlignment(ctx, syntax->align) : 0;

	TypeBase *parentType = ctx.scope->ownerType;

	if(parentType)
	{
		// Introduce 'this' variable into a temporary scope
		ctx.PushTemporaryScope();

		ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, ctx.GetReferenceType(parentType), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("this")), 0, ctx.uniqueVariableId++), true);
	}

	TypeBase *type = AnalyzeType(ctx, syntax->type);

	if(parentType)
		ctx.PopScope(SCOPE_TEMPORARY);

	IntrusiveList<ExprBase> definitions;

	for(SynVariableDefinition *el = syntax->definitions.head; el; el = getType<SynVariableDefinition>(el->next))
		definitions.push_back(AnalyzeVariableDefinition(ctx, el, alignment, type));

	return new (ctx.get<ExprVariableDefinitions>()) ExprVariableDefinitions(syntax, ctx.typeVoid, type, definitions);
}